

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O1

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
NodeView::kmer_coverage
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          NodeView *this,int kcovds_idx,int kcovds_count_idx)

{
  pointer pKVar1;
  string local_40;
  
  pKVar1 = (this->dg->sdg->ws->kmer_counters).
           super__Vector_base<KmerCounter,_std::allocator<KmerCounter>_>._M_impl.
           super__Vector_impl_data._M_start;
  SequenceDistanceGraph::get_node_sequence_abi_cxx11_(&local_40,this->dg->sdg,this->id);
  KmerCounter::project_count
            (__return_storage_ptr__,pKVar1 + kcovds_count_idx,(uint16_t)kcovds_count_idx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint16_t> NodeView::kmer_coverage(int kcovds_idx, int kcovds_count_idx) const {
    return dg->sdg.ws.kmer_counters[kcovds_count_idx].project_count(kcovds_count_idx,sequence());
}